

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

float ImGui::CalcItemWidth(void)

{
  ImGuiWindow *pIVar1;
  float *pfVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  
  if (((GImGui->NextItemData).Flags & 1) == 0) {
    pfVar2 = &(GImGui->CurrentWindow->DC).ItemWidth;
  }
  else {
    pfVar2 = &(GImGui->NextItemData).Width;
  }
  fVar5 = *pfVar2;
  if (fVar5 < 0.0) {
    pIVar1 = GImGui->CurrentWindow;
    lVar3 = 0x238;
    if (((pIVar1->DC).CurrentColumns == (ImGuiOldColumns *)0x0) &&
       (GImGui->CurrentTable == (ImGuiTable *)0x0)) {
      lVar3 = 0x268;
    }
    fVar4 = fVar5 + (*(float *)((long)&pIVar1->Ctx + lVar3) - (pIVar1->DC).CursorPos.x);
    fVar5 = 1.0;
    if (1.0 <= fVar4) {
      fVar5 = fVar4;
    }
  }
  return (float)(int)fVar5;
}

Assistant:

float ImGui::CalcItemWidth()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float w;
    if (g.NextItemData.Flags & ImGuiNextItemDataFlags_HasWidth)
        w = g.NextItemData.Width;
    else
        w = window->DC.ItemWidth;
    if (w < 0.0f)
    {
        float region_avail_x = GetContentRegionAvail().x;
        w = ImMax(1.0f, region_avail_x + w);
    }
    w = IM_TRUNC(w);
    return w;
}